

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aecm_core_c.cc
# Opt level: O2

int TimeToFrequencyDomain
              (AecmCore *aecm,int16_t *time_signal,ComplexInt16 *freq_signal,
              uint16_t *freq_signal_abs,uint32_t *freq_signal_sum_abs)

{
  int16_t a;
  ushort uVar1;
  int32_t iVar2;
  short *psVar3;
  ushort uVar4;
  ushort uVar5;
  uint32_t uVar6;
  ushort uVar7;
  long lVar8;
  int16_t fft_buf [272];
  
  a = (*WebRtcSpl_MaxAbsValueW16)(time_signal,0x80);
  uVar1 = WebRtcSpl_NormW16(a);
  psVar3 = WebRtcAecm_kSqrtHanning + 0x40;
  for (lVar8 = 0; lVar8 != 0x80; lVar8 = lVar8 + 2) {
    *(short *)((long)(fft_buf + 0xc) + lVar8) =
         (short)((uint)((int)*(short *)((long)WebRtcAecm_kSqrtHanning + lVar8) *
                       (int)(short)(*(short *)((long)time_signal + lVar8) << ((byte)uVar1 & 0x1f)))
                >> 0xe);
    *(short *)((long)fft_buf + lVar8 + 0x98) =
         (short)((uint)((int)*psVar3 *
                       (int)(short)(*(short *)((long)time_signal + lVar8 + 0x80) <<
                                   ((byte)uVar1 & 0x1f))) >> 0xe);
    psVar3 = psVar3 + -1;
  }
  WebRtcSpl_RealForwardFFT(aecm->real_fft,fft_buf + 0xc,&freq_signal->real);
  for (lVar8 = 2; lVar8 != 0x102; lVar8 = lVar8 + 4) {
    psVar3 = (short *)((long)&freq_signal->real + lVar8);
    *psVar3 = -*psVar3;
  }
  freq_signal->imag = 0;
  freq_signal[0x40].imag = 0;
  uVar5 = freq_signal->real;
  uVar4 = -uVar5;
  if (0 < (short)uVar5) {
    uVar4 = uVar5;
  }
  *freq_signal_abs = uVar4;
  uVar5 = freq_signal[0x40].real;
  uVar7 = -uVar5;
  if (0 < (short)uVar5) {
    uVar7 = uVar5;
  }
  freq_signal_abs[0x40] = uVar7;
  uVar6 = (uint)uVar7 + (uint)uVar4;
  *freq_signal_sum_abs = uVar6;
  lVar8 = 0;
  do {
    if (lVar8 == 0x3f) {
      return (uint)uVar1;
    }
    uVar5 = freq_signal[lVar8 + 1].real;
    uVar4 = freq_signal[lVar8 + 1].imag;
    if (uVar5 == 0) {
      uVar7 = -uVar4;
      if (0 < (short)uVar4) {
        uVar7 = uVar4;
      }
LAB_0016fc50:
      freq_signal_abs[lVar8 + 1] = uVar7;
    }
    else {
      uVar7 = -uVar5;
      if (0 < (short)uVar5) {
        uVar7 = uVar5;
      }
      if (uVar4 == 0) goto LAB_0016fc50;
      uVar5 = -uVar4;
      if (0 < (short)uVar4) {
        uVar5 = uVar4;
      }
      iVar2 = WebRtcSpl_SqrtFloor((int)(short)uVar5 * (int)(short)uVar5 +
                                  (int)(short)uVar7 * (int)(short)uVar7);
      uVar7 = (ushort)iVar2;
      freq_signal_abs[lVar8 + 1] = uVar7;
      uVar6 = *freq_signal_sum_abs;
    }
    uVar6 = uVar6 + uVar7;
    *freq_signal_sum_abs = uVar6;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

static int TimeToFrequencyDomain(AecmCore* aecm,
                                 const int16_t* time_signal,
                                 ComplexInt16* freq_signal,
                                 uint16_t* freq_signal_abs,
                                 uint32_t* freq_signal_sum_abs) {
  int i = 0;
  int time_signal_scaling = 0;

  int32_t tmp32no1 = 0;
  int32_t tmp32no2 = 0;

  // In fft_buf, +16 for 32-byte alignment.
  int16_t fft_buf[PART_LEN4 + 16];
  int16_t *fft = (int16_t *) (((uintptr_t) fft_buf + 31) & ~31);

  int16_t tmp16no1;
#ifndef WEBRTC_ARCH_ARM_V7
  int16_t tmp16no2;
#endif
#ifdef AECM_WITH_ABS_APPROX
  int16_t max_value = 0;
  int16_t min_value = 0;
  uint16_t alpha = 0;
  uint16_t beta = 0;
#endif

#ifdef AECM_DYNAMIC_Q
  tmp16no1 = WebRtcSpl_MaxAbsValueW16(time_signal, PART_LEN2);
  time_signal_scaling = WebRtcSpl_NormW16(tmp16no1);
#endif

  WindowAndFFT(aecm, fft, time_signal, freq_signal, time_signal_scaling);

  // Extract imaginary and real part, calculate the magnitude for
  // all frequency bins
  freq_signal[0].imag = 0;
  freq_signal[PART_LEN].imag = 0;
  freq_signal_abs[0] = (uint16_t)WEBRTC_SPL_ABS_W16(freq_signal[0].real);
  freq_signal_abs[PART_LEN] = (uint16_t)WEBRTC_SPL_ABS_W16(
                                freq_signal[PART_LEN].real);
  (*freq_signal_sum_abs) = (uint32_t)(freq_signal_abs[0]) +
                           (uint32_t)(freq_signal_abs[PART_LEN]);

  for (i = 1; i < PART_LEN; i++)
  {
    if (freq_signal[i].real == 0)
    {
      freq_signal_abs[i] = (uint16_t)WEBRTC_SPL_ABS_W16(freq_signal[i].imag);
    }
    else if (freq_signal[i].imag == 0)
    {
      freq_signal_abs[i] = (uint16_t)WEBRTC_SPL_ABS_W16(freq_signal[i].real);
    }
    else
    {
      // Approximation for magnitude of complex fft output
      // magn = sqrt(real^2 + imag^2)
      // magn ~= alpha * max(|imag|,|real|) + beta * min(|imag|,|real|)
      //
      // The parameters alpha and beta are stored in Q15

#ifdef AECM_WITH_ABS_APPROX
      tmp16no1 = WEBRTC_SPL_ABS_W16(freq_signal[i].real);
      tmp16no2 = WEBRTC_SPL_ABS_W16(freq_signal[i].imag);

      if(tmp16no1 > tmp16no2)
      {
        max_value = tmp16no1;
        min_value = tmp16no2;
      } else
      {
        max_value = tmp16no2;
        min_value = tmp16no1;
      }

      // Magnitude in Q(-6)
      if ((max_value >> 2) > min_value)
      {
        alpha = kAlpha1;
        beta = kBeta1;
      } else if ((max_value >> 1) > min_value)
      {
        alpha = kAlpha2;
        beta = kBeta2;
      } else
      {
        alpha = kAlpha3;
        beta = kBeta3;
      }
      tmp16no1 = (int16_t)((max_value * alpha) >> 15);
      tmp16no2 = (int16_t)((min_value * beta) >> 15);
      freq_signal_abs[i] = (uint16_t)tmp16no1 + (uint16_t)tmp16no2;
#else
#ifdef WEBRTC_ARCH_ARM_V7
      __asm __volatile(
        "smulbb %[tmp32no1], %[real], %[real]\n\t"
        "smlabb %[tmp32no2], %[imag], %[imag], %[tmp32no1]\n\t"
        :[tmp32no1]"+&r"(tmp32no1),
         [tmp32no2]"=r"(tmp32no2)
        :[real]"r"(freq_signal[i].real),
         [imag]"r"(freq_signal[i].imag)
      );
#else
      tmp16no1 = WEBRTC_SPL_ABS_W16(freq_signal[i].real);
      tmp16no2 = WEBRTC_SPL_ABS_W16(freq_signal[i].imag);
      tmp32no1 = tmp16no1 * tmp16no1;
      tmp32no2 = tmp16no2 * tmp16no2;
      tmp32no2 = WebRtcSpl_AddSatW32(tmp32no1, tmp32no2);
#endif // WEBRTC_ARCH_ARM_V7
      tmp32no1 = WebRtcSpl_SqrtFloor(tmp32no2);

      freq_signal_abs[i] = (uint16_t)tmp32no1;
#endif // AECM_WITH_ABS_APPROX
    }
    (*freq_signal_sum_abs) += (uint32_t)freq_signal_abs[i];
  }

  return time_signal_scaling;
}